

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::SumState<duckdb::hugeint_t>,int,duckdb::SumToHugeintOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  int iVar1;
  unsigned_long *puVar2;
  int *piVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  long lVar6;
  idx_t iVar7;
  unsigned_long uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar12 = 0;
      uVar11 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = puVar2[uVar12];
        }
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar9 = uVar13;
        if (uVar8 != 0) {
          uVar9 = uVar11;
          if (uVar8 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              uVar9 = *(ulong *)(state + 8);
              do {
                iVar1 = *(int *)(pdVar4 + uVar11 * 4);
                uVar14 = (ulong)iVar1;
                uVar9 = uVar9 + uVar14;
                if (-1 < (long)uVar14 != uVar14 <= uVar9) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
                }
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
              *state = '\x01';
              *(ulong *)(state + 8) = uVar9;
              uVar9 = uVar11;
            }
          }
          else if (uVar11 < uVar13) {
            uVar9 = 0;
            do {
              if ((uVar8 >> (uVar9 & 0x3f) & 1) != 0) {
                *state = '\x01';
                iVar1 = *(int *)(pdVar4 + uVar9 * 4 + uVar11 * 4);
                uVar14 = (ulong)iVar1;
                lVar6 = *(long *)(state + 8);
                *(ulong *)(state + 8) = lVar6 + uVar14;
                if (-1 < (long)uVar14 != uVar14 <= lVar6 + uVar14) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
                }
              }
              uVar9 = uVar9 + 1;
            } while ((uVar11 - uVar13) + uVar9 != 0);
            uVar9 = uVar11 + uVar9;
          }
        }
        uVar12 = uVar12 + 1;
        uVar11 = uVar9;
      } while (uVar12 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      piVar3 = (int *)input->data;
      *state = '\x01';
      AddToHugeint::AddConstant<duckdb::SumState<duckdb::hugeint_t>,int>
                ((SumState<duckdb::hugeint_t> *)state,*piVar3,count);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_70);
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_70.sel)->sel_vector;
        uVar11 = *(ulong *)(state + 8);
        iVar7 = 0;
        do {
          iVar10 = iVar7;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar7];
          }
          uVar12 = (ulong)*(int *)(local_70.data + iVar10 * 4);
          uVar11 = uVar11 + uVar12;
          if (-1 < (long)uVar12 != uVar12 <= uVar11) {
            *(ulong *)(state + 0x10) =
                 *(long *)(state + 0x10) + (ulong)(-1 < *(int *)(local_70.data + iVar10 * 4)) * 2 +
                 -1;
          }
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
        *state = '\x01';
        *(ulong *)(state + 8) = uVar11;
      }
    }
    else if (count != 0) {
      psVar5 = (local_70.sel)->sel_vector;
      iVar7 = 0;
      do {
        iVar10 = iVar7;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar7];
        }
        if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) != 0) {
          *state = '\x01';
          iVar1 = *(int *)(local_70.data + iVar10 * 4);
          uVar11 = (ulong)iVar1;
          lVar6 = *(long *)(state + 8);
          *(ulong *)(state + 8) = lVar6 + uVar11;
          if (-1 < (long)uVar11 != uVar11 <= lVar6 + uVar11) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + (ulong)(-1 < iVar1) * 2 + -1;
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}